

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

void __thiscall despot::DESPOT::Compare(DESPOT *this)

{
  Belief *pBVar1;
  VNode *this_00;
  double dVar2;
  VNode *root;
  RandomStreams streams;
  undefined1 local_88 [8];
  SearchStatistics statistics;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  DESPOT *this_local;
  
  pBVar1 = (this->super_Solver).belief_;
  (*pBVar1->_vptr_Belief[2])(&statistics.num_trials,pBVar1,(ulong)(uint)DAT_00278a6c);
  SearchStatistics::SearchStatistics((SearchStatistics *)local_88);
  RandomStreams::RandomStreams((RandomStreams *)&root,DAT_00278a6c,DAT_00278a70);
  this_00 = ConstructTree((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                          &statistics.num_trials,(RandomStreams *)&root,this->lower_bound_,
                          this->upper_bound_,(this->super_Solver).model_,
                          &(this->super_Solver).history_,Globals::config,
                          (SearchStatistics *)local_88);
  dVar2 = VNode::lower_bound(this_00);
  CheckDESPOT(this,this_00,dVar2);
  dVar2 = VNode::lower_bound(this_00);
  CheckDESPOTSTAR(this,this_00,dVar2);
  if (this_00 != (VNode *)0x0) {
    VNode::~VNode(this_00);
    operator_delete(this_00,0x98);
  }
  RandomStreams::~RandomStreams((RandomStreams *)&root);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&statistics.num_trials);
  return;
}

Assistant:

void DESPOT::Compare() {
	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);
	SearchStatistics statistics;

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	VNode* root = ConstructTree(particles, streams, lower_bound_, upper_bound_,
		model_, history_, Globals::config.time_per_move, &statistics);

	CheckDESPOT(root, root->lower_bound());
	CheckDESPOTSTAR(root, root->lower_bound());
	delete root;
}